

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
* ear::extraPosVerticalNominal
            (pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             *__return_storage_ptr__,Layout *layout)

{
  storage_type *this;
  double dVar1;
  pointer pCVar2;
  pointer pcVar3;
  value_type *pvVar4;
  bool bVar5;
  PolarPosition polarPosition;
  undefined8 uVar6;
  undefined8 uVar7;
  pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *ppVar8;
  Index size;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar9;
  string *psVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  long lVar12;
  char *pcVar13;
  double *pdVar14;
  Channel *channel;
  pointer pCVar15;
  value_type *__x;
  double dVar16;
  undefined1 auVar17 [16];
  VectorXd downmixRow;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  MatrixXd downmix;
  vector<ear::Channel,_std::allocator<ear::Channel>_> extraChannels;
  Layout currentLayerLayout;
  Layout midLayerLayout;
  double local_3e8;
  double local_3d8;
  string local_3c8;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398 [2];
  double local_378;
  bool local_370;
  dummy_u local_368;
  bool local_350;
  dummy_u local_348;
  bool local_338;
  dummy_u local_330;
  bool local_320;
  Matrix<double,__1,__1,_0,__1,__1> local_318;
  double local_300;
  string local_2f8;
  optional<ear::PolarPosition> local_2d8;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_2b8;
  pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *local_298;
  long local_290;
  optional<std::pair<double,_double>_> local_288;
  optional<std::pair<double,_double>_> local_270;
  string local_258;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_238;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_218;
  undefined8 local_1f8;
  double dStack_1f0;
  double local_1e8;
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_1e0;
  double local_1a8 [4];
  undefined1 *local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  double local_170;
  Layout local_160;
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_f0;
  type local_b8;
  Layout local_a0;
  
  local_2b8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar9 = Layout::channels(layout);
  pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar9 = Layout::channels(layout);
  local_3a8._0_8_ = ((long)pCVar2 - (long)pCVar15 >> 4) * -0x71c71c71c71c71c7;
  local_3a8._8_8_ =
       ((long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
              super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
  if ((long)(local_3a8._8_8_ | local_3a8._0_8_) < 0) {
    pcVar13 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_0014e869:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,pcVar13);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_318,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_3a8);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
  local_218.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultScreen();
  this = &local_f0.super_type.m_storage;
  local_f0.super_type.m_initialized = false;
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::variant
            ((variant<ear::PolarScreen,_ear::CartesianScreen> *)this,
             (variant<ear::PolarScreen,_ear::CartesianScreen> *)local_3a8);
  local_f0.super_type.m_initialized = true;
  Layout::Layout(&local_a0,&local_258,&local_218,&local_f0);
  if (local_f0.super_type.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)this);
    local_f0.super_type.m_initialized = false;
  }
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
            ((variant<ear::PolarScreen,_ear::CartesianScreen> *)local_3a8);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  pvVar9 = Layout::channels(layout);
  pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pvVar9 = Layout::channels(layout);
  pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar9 = Layout::channels(&local_a0);
  local_298 = __return_storage_ptr__;
  if (pCVar15 != pCVar2) {
    do {
      pcVar3 = (pCVar15->_name)._M_dataplus._M_p;
      local_3a8._0_8_ = local_398;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3a8,pcVar3,pcVar3 + (pCVar15->_name)._M_string_length);
      local_378 = (pCVar15->_polarPosition).distance;
      local_398[1]._0_8_ = (pCVar15->_polarPosition).azimuth;
      local_398[1]._8_8_ = (pCVar15->_polarPosition).elevation;
      local_370 = (pCVar15->_polarPositionNominal).super_type.m_initialized == true;
      if (local_370) {
        local_368._16_8_ =
             *(undefined8 *)
              ((long)&(pCVar15->_polarPositionNominal).super_type.m_storage.dummy_ + 0x10);
        local_368.aligner_ = (pCVar15->_polarPositionNominal).super_type.m_storage.dummy_.aligner_;
        local_368._8_8_ =
             *(undefined8 *)
              ((long)&(pCVar15->_polarPositionNominal).super_type.m_storage.dummy_ + 8);
      }
      local_350 = (pCVar15->_azimuthRange).super_type.m_initialized == true;
      if (local_350) {
        local_348.aligner_ = (pCVar15->_azimuthRange).super_type.m_storage.dummy_.aligner_;
        local_348._8_8_ =
             *(undefined8 *)((long)&(pCVar15->_azimuthRange).super_type.m_storage.dummy_ + 8);
      }
      local_338 = (pCVar15->_elevationRange).super_type.m_initialized == true;
      if (local_338) {
        local_330.aligner_ = (pCVar15->_elevationRange).super_type.m_storage.dummy_.aligner_;
        local_330._8_8_ =
             *(undefined8 *)((long)&(pCVar15->_elevationRange).super_type.m_storage.dummy_ + 8);
      }
      local_320 = pCVar15->_isLfe;
      Channel::polarPositionNominal((Channel *)local_3a8);
      if (-10.0 <= (double)local_160._name._M_string_length) {
        Channel::polarPositionNominal((Channel *)local_3a8);
        bVar5 = local_1a8[1] <= 10.0;
      }
      else {
        bVar5 = false;
      }
      if (local_338 == true) {
        local_338 = false;
      }
      if (local_350 == true) {
        local_350 = false;
      }
      if (local_370 == true) {
        local_370 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._0_8_ != local_398) {
        operator_delete((void *)local_3a8._0_8_,local_398[0]._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::push_back(pvVar9,pCVar15);
      }
      pCVar15 = pCVar15 + 1;
    } while (pCVar15 != pCVar2);
  }
  local_1a8[0] = -10.0;
  local_1a8[1] = -70.0;
  local_1a8[2] = -30.0;
  local_1a8[3] = 70.0;
  local_188 = &DAT_4024000000000000;
  uStack_180 = 0x403e000000000000;
  lVar12 = 0;
  do {
    local_300 = *(double *)((long)local_1a8 + lVar12 + 0x10);
    dVar16 = *(double *)((long)local_1a8 + lVar12);
    dVar1 = *(double *)((long)local_1a8 + lVar12 + 8);
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    local_290 = lVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
    local_238.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getDefaultScreen();
    local_1e0.super_type.m_initialized = false;
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::variant
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)&local_1e0.super_type.m_storage,
               (variant<ear::PolarScreen,_ear::CartesianScreen> *)local_3a8);
    local_1e0.super_type.m_initialized = true;
    Layout::Layout(&local_160,&local_2f8,&local_238,&local_1e0);
    if (local_1e0.super_type.m_initialized == true) {
      boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
                ((variant<ear::PolarScreen,_ear::CartesianScreen> *)&local_1e0.super_type.m_storage)
      ;
      local_1e0.super_type.m_initialized = false;
    }
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)local_3a8);
    std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    pvVar9 = Layout::channels(layout);
    __x = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
          super__Vector_impl_data._M_start;
    pvVar9 = Layout::channels(layout);
    pvVar4 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pvVar9 = Layout::channels(&local_160);
    for (; __x != pvVar4; __x = __x + 1) {
      pcVar3 = (__x->_name)._M_dataplus._M_p;
      local_3a8._0_8_ = local_398;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3a8,pcVar3,pcVar3 + (__x->_name)._M_string_length);
      local_378 = (__x->_polarPosition).distance;
      local_398[1]._0_8_ = (__x->_polarPosition).azimuth;
      local_398[1]._8_8_ = (__x->_polarPosition).elevation;
      local_370 = (__x->_polarPositionNominal).super_type.m_initialized == true;
      if (local_370) {
        local_368._16_8_ =
             *(undefined8 *)((long)&(__x->_polarPositionNominal).super_type.m_storage.dummy_ + 0x10)
        ;
        local_368.aligner_ = (__x->_polarPositionNominal).super_type.m_storage.dummy_.aligner_;
        local_368._8_8_ =
             *(undefined8 *)((long)&(__x->_polarPositionNominal).super_type.m_storage.dummy_ + 8);
      }
      local_350 = (__x->_azimuthRange).super_type.m_initialized == true;
      if (local_350) {
        local_348.aligner_ = (__x->_azimuthRange).super_type.m_storage.dummy_.aligner_;
        local_348._8_8_ =
             *(undefined8 *)((long)&(__x->_azimuthRange).super_type.m_storage.dummy_ + 8);
      }
      local_338 = (__x->_elevationRange).super_type.m_initialized == true;
      if (local_338) {
        local_330.aligner_ = (__x->_elevationRange).super_type.m_storage.dummy_.aligner_;
        local_330._8_8_ =
             *(undefined8 *)((long)&(__x->_elevationRange).super_type.m_storage.dummy_ + 8);
      }
      local_320 = __x->_isLfe;
      Channel::polarPositionNominal((Channel *)local_3a8);
      if (dVar1 <= (double)local_3c8._M_string_length) {
        Channel::polarPositionNominal((Channel *)local_3a8);
        bVar5 = local_170 <= dVar16;
      }
      else {
        bVar5 = false;
      }
      if (local_338 == true) {
        local_338 = false;
      }
      if (local_350 == true) {
        local_350 = false;
      }
      if (local_370 == true) {
        local_370 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._0_8_ != local_398) {
        operator_delete((void *)local_3a8._0_8_,local_398[0]._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::push_back(pvVar9,__x);
      }
    }
    pvVar9 = Layout::channels(&local_160);
    local_3e8 = local_300;
    local_3d8 = -1e-05;
    if ((pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      pvVar9 = Layout::channels(&local_160);
      pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_3d8 = 39.99999;
      if (pCVar15 != pCVar2) {
        local_3d8 = 2.2250738585072014e-308;
        do {
          Channel::polarPositionNominal(pCVar15);
          if (local_3d8 < ABS((double)local_3a8._0_8_)) {
            Channel::polarPositionNominal(pCVar15);
            local_3d8 = ABS((double)local_3a8._0_8_);
          }
          pCVar15 = pCVar15 + 1;
        } while (pCVar15 != pCVar2);
        local_3d8 = local_3d8 + 40.0 + -1e-05;
      }
      pvVar9 = Layout::channels(&local_160);
      pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pvVar9 = Layout::channels(&local_160);
      pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar15 == pCVar2) {
        local_3e8 = 0.0;
      }
      else {
        local_3e8 = 0.0;
        do {
          Channel::polarPosition(pCVar15);
          local_3e8 = local_3e8 + (double)local_3a8._8_8_;
          pCVar15 = pCVar15 + 1;
        } while (pCVar15 != pCVar2);
      }
      pvVar9 = Layout::channels(&local_160);
      lVar12 = ((long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
      auVar17._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar17._0_8_ = lVar12;
      auVar17._12_4_ = 0x45300000;
      local_3e8 = local_3e8 /
                  ((auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
    }
    pvVar9 = Layout::channels(&local_a0);
    pCVar2 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar15 = (pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl
                   .super__Vector_impl_data._M_start; pCVar15 != pCVar2; pCVar15 = pCVar15 + 1) {
      Channel::polarPosition(pCVar15);
      if (local_3d8 <= ABS((double)local_3a8._0_8_)) {
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"extra","");
        Channel::polarPosition(pCVar15);
        local_1f8 = local_178;
        dStack_1f0 = local_3e8;
        local_1e8 = 1.0;
        Channel::polarPositionNominal(pCVar15);
        local_2d8.super_type.m_storage.dummy_.aligner_ = local_b8;
        local_2d8.super_type.m_storage.dummy_._8_8_ = local_300;
        local_2d8.super_type.m_storage.dummy_._16_8_ = 0x3ff0000000000000;
        local_2d8.super_type.m_initialized = true;
        local_270.super_type.m_initialized = false;
        local_288.super_type.m_initialized = false;
        polarPosition.elevation = dStack_1f0;
        polarPosition.azimuth = (double)local_1f8;
        polarPosition.distance = local_1e8;
        Channel::Channel((Channel *)local_3a8,&local_3c8,polarPosition,&local_2d8,&local_270,
                         &local_288,false);
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::emplace_back<ear::Channel>
                  (&local_2b8,(Channel *)local_3a8);
        if (local_338 == true) {
          local_338 = false;
        }
        if (local_350 == true) {
          local_350 = false;
        }
        if (local_370 == true) {
          local_370 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._0_8_ != local_398) {
          operator_delete((void *)local_3a8._0_8_,local_398[0]._M_allocated_capacity + 1);
        }
        if (local_288.super_type.m_initialized == true) {
          local_288.super_type.m_initialized = false;
        }
        if (local_270.super_type.m_initialized == true) {
          local_270.super_type.m_initialized = false;
        }
        if (local_2d8.super_type.m_initialized == true) {
          local_2d8.super_type.m_initialized = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        pvVar9 = Layout::channels(layout);
        lVar12 = (long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar9->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>).
                       _M_impl.super__Vector_impl_data._M_start;
        local_3a8._0_8_ = (lVar12 >> 4) * -0x71c71c71c71c71c7;
        local_398[0]._M_allocated_capacity = 0;
        if (lVar12 < -0x8f) {
          pcVar13 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_0014e869;
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_3c8,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_3a8);
        Layout::channelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3a8,layout);
        uVar7 = local_3a8._8_8_;
        uVar6 = local_3a8._0_8_;
        psVar10 = Channel::name_abi_cxx11_(pCVar15);
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (uVar6,uVar7,psVar10);
        lVar12 = (long)(int)((ulong)((long)_Var11._M_current - uVar6) >> 5);
        if ((lVar12 < 0) || ((long)local_3c8._M_string_length <= lVar12)) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        pcVar13 = local_3c8._M_dataplus._M_p + lVar12 * 8;
        pcVar13[0] = '\0';
        pcVar13[1] = '\0';
        pcVar13[2] = '\0';
        pcVar13[3] = '\0';
        pcVar13[4] = '\0';
        pcVar13[5] = '\0';
        pcVar13[6] = -0x10;
        pcVar13[7] = '?';
        Eigen::internal::
        conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
        ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_318,
              local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows + 1,
              local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
        if (local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 0 &&
            local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                        ,0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                       );
        }
        if (local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows < 1) {
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        if (local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_3c8._M_string_length) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseBase.h"
                        ,0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
                       );
        }
        if (0 < local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_cols) {
          pdVar14 = local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data +
                    local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows + -1;
          dVar16 = 0.0;
          do {
            *pdVar14 = *(double *)(local_3c8._M_dataplus._M_p + (long)dVar16 * 8);
            dVar16 = (double)((long)dVar16 + 1);
            pdVar14 = pdVar14 + local_318.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
          } while ((double)local_318.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols != dVar16);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3a8);
        free(local_3c8._M_dataplus._M_p);
      }
    }
    if (local_160._screen.super_type.m_initialized == true) {
      boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
                ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
                 &local_160._screen.super_type.m_storage);
      local_160._screen.super_type.m_initialized = false;
    }
    std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_160._channels);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._name._M_dataplus._M_p != &local_160._name.field_2) {
      operator_delete(local_160._name._M_dataplus._M_p,
                      local_160._name.field_2._M_allocated_capacity + 1);
    }
    ppVar8 = local_298;
    lVar12 = local_290 + 0x18;
    if (lVar12 == 0x30) {
      std::
      pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::
      pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_true>
                (local_298,&local_2b8,&local_318);
      if (local_a0._screen.super_type.m_initialized == true) {
        boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
                  ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
                   &local_a0._screen.super_type.m_storage);
        local_a0._screen.super_type.m_initialized = false;
      }
      std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_a0._channels);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._name._M_dataplus._M_p != &local_a0._name.field_2) {
        operator_delete(local_a0._name._M_dataplus._M_p,
                        local_a0._name.field_2._M_allocated_capacity + 1);
      }
      free(local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_2b8);
      return ppVar8;
    }
  } while( true );
}

Assistant:

std::pair<std::vector<Channel>, Eigen::MatrixXd> extraPosVerticalNominal(
      Layout layout) {
    std::vector<Channel> extraChannels;
    Eigen::MatrixXd downmix = Eigen::MatrixXd::Identity(
        layout.channels().size(), layout.channels().size());

    Layout midLayerLayout;
    std::copy_if(layout.channels().begin(), layout.channels().end(),
                 std::back_inserter(midLayerLayout.channels()), [](Channel c) {
                   return -10 <= c.polarPositionNominal().elevation &&
                          c.polarPositionNominal().elevation <= 10;
                 });

    auto layers = {std::make_tuple(-30.0, -70.0, -10.0),
                   std::make_tuple(30.0, 10.0, 70.0)};

    double layerNominalElevation, layerLowerBound, layerUpperBound;
    for (const auto& layer : layers) {
      std::tie(layerNominalElevation, layerLowerBound, layerUpperBound) = layer;

      Layout currentLayerLayout;
      std::copy_if(
          layout.channels().begin(), layout.channels().end(),
          std::back_inserter(currentLayerLayout.channels()), [&](Channel c) {
            return layerLowerBound <= c.polarPositionNominal().elevation &&
                   c.polarPositionNominal().elevation <= layerUpperBound;
          });

      // for each loudspeaker in the mid layer that has an azimuth greater
      // than az_limit, add a virtual speaker directly above/below it at the
      // elevation of the current layer, which is downmixed directly to the
      // mid layer loudspeaker. az_limit is set to the range of azimuths in
      // the current layer, with some space added to prevent fast vertical
      // source movements when sources move horizontally. If there are no
      // channels on this layer then a copy of all mid layer speakers is
      // made.
      double azimuthLimit = 0.0;
      double layerRealElevation = 0.0;
      if (currentLayerLayout.channels().size() != 0) {
        double azimuthRange = std::numeric_limits<double>::min();
        for (const auto& channel : currentLayerLayout.channels()) {
          if (azimuthRange < std::abs(channel.polarPositionNominal().azimuth)) {
            azimuthRange = std::abs(channel.polarPositionNominal().azimuth);
          }
        }
        azimuthLimit = azimuthRange + 40.0;
        layerRealElevation =
            std::accumulate(currentLayerLayout.channels().begin(),
                            currentLayerLayout.channels().end(), 0.0,
                            [&](double sum, const Channel& c) -> double {
                              return sum + c.polarPosition().elevation;
                            }) /
            static_cast<double>(currentLayerLayout.channels().size());
      } else {
        layerRealElevation = layerNominalElevation;
      }

      double epsilon = 1e-5;
      for (const auto& midChannel : midLayerLayout.channels()) {
        if (std::abs(midChannel.polarPosition().azimuth) >=
            azimuthLimit - epsilon) {
          extraChannels.push_back(Channel(
              "extra",
              PolarPosition(midChannel.polarPosition().azimuth,
                            layerRealElevation, 1.0),
              PolarPosition(midChannel.polarPositionNominal().azimuth,
                            layerNominalElevation, 1.0)

                  ));
          Eigen::VectorXd downmixRow =
              Eigen::VectorXd::Zero(layout.channels().size());
          auto names = layout.channelNames();
          int midChannelIndex = static_cast<int>(std::distance(
              names.begin(),
              std::find(names.begin(), names.end(), midChannel.name())));
          downmixRow(midChannelIndex) = 1.0;
          downmix.conservativeResize(downmix.rows() + 1, Eigen::NoChange);
          downmix.row(downmix.rows() - 1) = downmixRow;
        }
      }
    }
    return std::make_pair(extraChannels, downmix);
  }